

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibCellProfile(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,int nFanins,int *Perm,
                       int *pProf)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)nFanins;
  if (nFanins < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    iVar3 = 1;
    if (Perm[uVar2] < (int)(*(uint *)&pCellBot->field_0x10 >> 0x1c)) {
      iVar3 = 2 - (uint)(pCellTop == (Mio_Cell2_t *)0x0);
    }
    pProf[uVar2] = iVar3;
  }
  return;
}

Assistant:

void Sfm_LibCellProfile( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, int nFanins, int * Perm, int * pProf )
{
    int i, DelayAdd = pCellTop ? 1 : 0;
    for ( i = 0; i < nFanins; i++ )
        if ( Perm[i] < (int)pCellBot->nFanins )
            pProf[i] = 1 + DelayAdd;
        else if ( Perm[i] < (int)pCellBot->nFanins + InTop )
            pProf[i] = 1;
        else // if ( Perm[i] >= (int)pCellBot->nFanins + InTop )
            pProf[i] = 1;
}